

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result * CoreML::validateOutputCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  int iVar1;
  LayerCase LVar2;
  string *psVar3;
  string local_478;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined4 local_1b4;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string err;
  int max_local;
  int min_local;
  NeuralNetworkLayer *layer_local;
  
  err.field_2._8_4_ = max;
  err.field_2._12_4_ = min;
  if (max < min && -1 < max) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0xa3,
                  "Result CoreML::validateOutputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  std::__cxx11::string::string((string *)local_40);
  if ((((int)err.field_2._8_4_ < 1) || (err.field_2._8_4_ != err.field_2._12_4_)) ||
     (iVar1 = Specification::NeuralNetworkLayer::output_size(layer), iVar1 == err.field_2._8_4_)) {
    if (((int)err.field_2._12_4_ < 1) ||
       (iVar1 = Specification::NeuralNetworkLayer::output_size(layer),
       (int)err.field_2._12_4_ <= iVar1)) {
      if (((int)err.field_2._8_4_ < 1) ||
         (iVar1 = Specification::NeuralNetworkLayer::output_size(layer),
         iVar1 <= (int)err.field_2._8_4_)) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+(&local_418,"Layer \'",psVar3);
        std::operator+(&local_3f8,&local_418,"\' of type ");
        LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
        std::__cxx11::to_string(&local_438,LVar2);
        std::operator+(&local_3d8,&local_3f8,&local_438);
        std::operator+(&local_3b8,&local_3d8," has ");
        iVar1 = Specification::NeuralNetworkLayer::output_size(layer);
        std::__cxx11::to_string(&local_458,iVar1);
        std::operator+(&local_398,&local_3b8,&local_458);
        std::operator+(&local_378,&local_398," outputs but expects at most ");
        std::__cxx11::to_string(&local_478,err.field_2._8_4_);
        std::operator+(&local_358,&local_378,&local_478);
        std::operator+(&local_338,&local_358,".");
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_418);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
      }
    }
    else {
      psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
      std::operator+(&local_2b8,"Layer \'",psVar3);
      std::operator+(&local_298,&local_2b8,"\' of type ");
      LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
      std::__cxx11::to_string(&local_2d8,LVar2);
      std::operator+(&local_278,&local_298,&local_2d8);
      std::operator+(&local_258,&local_278," has ");
      iVar1 = Specification::NeuralNetworkLayer::output_size(layer);
      std::__cxx11::to_string(&local_2f8,iVar1);
      std::operator+(&local_238,&local_258,&local_2f8);
      std::operator+(&local_218,&local_238," outputs but expects at least ");
      std::__cxx11::to_string(&local_318,err.field_2._12_4_);
      std::operator+(&local_1f8,&local_218,&local_318);
      std::operator+(&local_1d8,&local_1f8,".");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
    }
  }
  else {
    psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
    std::operator+(&local_150,"Layer \'",psVar3);
    std::operator+(&local_130,&local_150,"\' of type ");
    LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
    std::__cxx11::to_string(&local_170,LVar2);
    std::operator+(&local_110,&local_130,&local_170);
    std::operator+(&local_f0,&local_110," has ");
    iVar1 = Specification::NeuralNetworkLayer::output_size(layer);
    std::__cxx11::to_string(&local_190,iVar1);
    std::operator+(&local_d0,&local_f0,&local_190);
    std::operator+(&local_b0,&local_d0," outputs but expects exactly ");
    std::__cxx11::to_string(&local_1b0,err.field_2._12_4_);
    std::operator+(&local_90,&local_b0,&local_1b0);
    std::operator+(&local_70,&local_90,".");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
  }
  local_1b4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOutputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {

    assert( min <= max || max < 0 );
    std::string err;

    if (max > 0 && max == min && layer.output_size() != max) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.output_size()) + " outputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.output_size() < min) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.output_size()) + " outputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.output_size() > max) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.output_size()) + " outputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}